

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O0

string * __thiscall
cmPolicies::GetRequiredPolicyError_abi_cxx11_
          (string *__return_storage_ptr__,cmPolicies *this,PolicyID id)

{
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  PolicyID local_2c;
  string *psStack_28;
  PolicyID id_local;
  
  local_2c = (PolicyID)this;
  psStack_28 = __return_storage_ptr__;
  local_38 = idToString(local_2c);
  local_40 = idToShortDescription(local_2c);
  local_48 = idToString(local_2c);
  local_50 = idToString(local_2c);
  local_58 = idToVersion(local_2c);
  cmStrCat<char_const(&)[8],char_const*,char_const(&)[21],char_const*,char_const(&)[28],char_const*,char_const(&)[156],char_const*,char_const(&)[73],char_const*,char_const(&)[75]>
            (__return_storage_ptr__,(char (*) [8])"Policy ",&local_38,
             (char (*) [21])" is not set to NEW: ",&local_40,
             (char (*) [28])"  Run \"cmake --help-policy ",&local_48,
             (char (*) [156])
             "\" for policy details.  CMake now requires this policy to be set to NEW by the project.  The policy may be set explicitly using the code\n  cmake_policy(SET "
             ,&local_50,
             (char (*) [73])
             " NEW)\nor by upgrading all policies with the code\n  cmake_policy(VERSION ",&local_58,
             (char (*) [75])
             ") # or later\nRun \"cmake --help-command cmake_policy\" for more information.");
  return __return_storage_ptr__;
}

Assistant:

std::string cmPolicies::GetRequiredPolicyError(cmPolicies::PolicyID id)
{
  return cmStrCat(
    "Policy ", idToString(id),
    " is not set to NEW: ", idToShortDescription(id),
    "  "
    "Run \"cmake --help-policy ",
    idToString(id),
    "\" for policy details.  "
    "CMake now requires this policy to be set to NEW by the project.  "
    "The policy may be set explicitly using the code\n"
    "  cmake_policy(SET ",
    idToString(id),
    " NEW)\n"
    "or by upgrading all policies with the code\n"
    "  cmake_policy(VERSION ",
    idToVersion(id),
    ") # or later\n"
    "Run \"cmake --help-command cmake_policy\" for more information.");
}